

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_nbget_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,void *buf,
              Integer *ld,Integer *nbhandle)

{
  undefined8 *in_RCX;
  undefined8 *in_RSI;
  Integer *in_R8;
  Integer *in_R9;
  Integer hi [2];
  Integer lo [2];
  void *in_stack_ffffffffffffffc8;
  
  pnga_nbget((Integer)in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,(Integer *)*in_RCX,
             (Integer *)*in_RSI);
  return;
}

Assistant:

void FATR ga_nbget_(Integer *g_a, Integer *ilo, Integer *ihi,
                    Integer *jlo, Integer *jhi, void *buf,
                    Integer *ld, Integer *nbhandle)
{
  Integer lo[2], hi[2];
  lo[0]=*ilo;
  lo[1]=*jlo;
  hi[0]=*ihi;
  hi[1]=*jhi;
  wnga_nbget(*g_a, lo, hi, buf, ld, nbhandle);
}